

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::HostInfo::HostName_abi_cxx11_(string *__return_storage_ptr__,HostInfo *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string HostInfo::HostName() const
{
    return m_hostName;
}